

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

gguf_context * gguf_init_from_file_impl(FILE *file,gguf_init_params params)

{
  char cVar1;
  char cVar2;
  char cVar3;
  ggml_context *ctx_00;
  ggml_init_params params_00;
  bool bVar4;
  __type _Var5;
  int iVar6;
  gguf_context *pgVar7;
  reference pvVar8;
  uint *puVar9;
  int64_t iVar10;
  ulong uVar11;
  undefined8 uVar12;
  char *pcVar13;
  long lVar14;
  size_t sVar15;
  size_type sVar16;
  reference pvVar17;
  ggml_context *__nbytes;
  ssize_t sVar18;
  size_type sVar19;
  ggml_tensor *tensor;
  uint *in_RCX;
  size_t __nbytes_00;
  long *in_RDX;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *__buf_00;
  void *__buf_01;
  byte in_SIL;
  FILE *in_RDI;
  ggml_tensor *cur;
  gguf_tensor_info *info_1;
  size_t i_4;
  ggml_tensor *data;
  ggml_context *ctx_data;
  ggml_init_params pdata;
  size_t mem_size;
  gguf_tensor_info *ti;
  size_t i_3;
  int j_3;
  int64_t blck_size;
  size_t type_size;
  uint32_t j_2;
  uint32_t n_dims;
  int64_t j_1;
  length_error *anon_var_0_2;
  bad_alloc *anon_var_0_3;
  string name;
  gguf_tensor_info info;
  int64_t i_2;
  int alignment_idx;
  size_t j;
  length_error *anon_var_0;
  bad_alloc *anon_var_0_1;
  uint64_t n;
  bool is_array;
  gguf_type type;
  string key;
  int64_t i_1;
  int64_t n_tensors;
  int64_t n_kv;
  uint32_t i;
  vector<char,_std::allocator<char>_> magic;
  bool ok;
  gguf_context *ctx;
  gguf_reader gr;
  unsigned_long *in_stack_fffffffffffffba8;
  undefined4 uVar20;
  gguf_context *in_stack_fffffffffffffbb0;
  size_t in_stack_fffffffffffffbb8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffbc0;
  undefined7 in_stack_fffffffffffffbc8;
  undefined1 in_stack_fffffffffffffbcf;
  gguf_context *in_stack_fffffffffffffbd0;
  byte local_422;
  bool local_421;
  long local_410;
  undefined7 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc0f;
  undefined7 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc17;
  string *in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  undefined4 in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc2c;
  vector<gguf_kv,_std::allocator<gguf_kv>_> *in_stack_fffffffffffffc30;
  gguf_reader *in_stack_fffffffffffffc38;
  undefined1 in_stack_fffffffffffffc47;
  string *in_stack_fffffffffffffc48;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  gguf_reader *in_stack_fffffffffffffc58;
  FILE *pFVar21;
  byte bVar22;
  uint32_t uVar23;
  bool local_377;
  bool local_375;
  bool local_373;
  bool local_371;
  bool local_36f;
  bool local_36d;
  bool local_36b;
  bool local_369;
  bool local_35d;
  byte local_35b;
  byte local_359;
  byte local_33a;
  bool local_2f9;
  size_type local_2e8;
  ggml_tensor *local_2e0;
  ulong local_290;
  size_type local_268;
  string local_250 [32];
  ggml_tensor local_230;
  long local_d8;
  int local_cc;
  uint *local_c8;
  undefined8 local_b0;
  byte local_a5;
  uint local_a4;
  string local_a0 [32];
  long local_80;
  uint *local_78;
  uint *local_70;
  uint local_64;
  int local_60;
  vector<char,_std::allocator<char>_> local_50;
  bool local_31;
  gguf_context *local_30;
  gguf_reader local_28;
  FILE *local_20;
  byte local_18;
  long *local_10;
  gguf_context *local_8;
  
  local_20 = in_RDI;
  local_18 = in_SIL;
  local_10 = in_RDX;
  gguf_reader::gguf_reader(&local_28,(FILE *)in_RDI);
  pgVar7 = (gguf_context *)operator_new(0x58);
  gguf_context::gguf_context(in_stack_fffffffffffffbb0);
  local_31 = true;
  local_30 = pgVar7;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x18cb85);
  local_2f9 = false;
  if ((local_31 & 1U) != 0) {
    local_2f9 = gguf_reader::read<char>
                          ((gguf_reader *)
                           CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
                           in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  }
  local_31 = local_2f9;
  if (local_2f9 == false) {
    fprintf(_stderr,"%s: failed to read magic\n","gguf_init_from_file_impl");
    gguf_free(in_stack_fffffffffffffbb0);
    local_8 = (gguf_context *)0x0;
    local_60 = 1;
  }
  else {
    for (local_64 = 0; puVar9 = (uint *)(ulong)local_64,
        in_RCX = (uint *)std::vector<char,_std::allocator<char>_>::size(&local_50), puVar9 < in_RCX;
        local_64 = local_64 + 1) {
      pvVar8 = std::vector<char,_std::allocator<char>_>::operator[](&local_50,(ulong)local_64);
      pFVar21 = _stderr;
      if (*pvVar8 != "GGUF"[local_64]) {
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[](&local_50,0);
        uVar20 = (undefined4)((ulong)in_stack_fffffffffffffba8 >> 0x20);
        cVar1 = *pvVar8;
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[](&local_50,1);
        cVar2 = *pvVar8;
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[](&local_50,2);
        cVar3 = *pvVar8;
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[](&local_50,3);
        in_RCX = (uint *)(ulong)(uint)(int)cVar1;
        in_stack_fffffffffffffba8 = (unsigned_long *)CONCAT44(uVar20,(int)*pvVar8);
        fprintf(pFVar21,"%s: invalid magic characters: \'%c%c%c%c\', expected \'GGUF\'\n",
                "gguf_init_from_file_impl",in_RCX,(ulong)(uint)(int)cVar2,(ulong)(uint)(int)cVar3);
        gguf_free(in_stack_fffffffffffffbb0);
        local_8 = (gguf_context *)0x0;
        local_60 = 1;
        goto LAB_0018cdda;
      }
    }
    local_60 = 0;
  }
LAB_0018cdda:
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffbc0);
  if (local_60 == 0) {
    local_70 = (uint *)0x0;
    local_78 = (uint *)0x0;
    if (((local_31 & 1U) == 0) ||
       (bVar4 = gguf_reader::read<unsigned_int>
                          ((gguf_reader *)in_stack_fffffffffffffbb0,
                           (uint *)in_stack_fffffffffffffba8), !bVar4)) {
      local_31 = false;
    }
    else {
      if (local_30->version == 1) {
        fprintf(_stderr,"%s: GGUFv1 is no longer supported, please use a more up-to-date version\n",
                "gguf_init_from_file_impl");
        local_31 = false;
      }
      if (3 < local_30->version) {
        in_RCX = (uint *)(ulong)local_30->version;
        fprintf(_stderr,
                "%s: this GGUF file is version %u but this software only supports up to version %d\n"
                ,"gguf_init_from_file_impl",in_RCX,3);
        local_31 = false;
      }
    }
    if (((local_31 & 1U) == 0) ||
       (bVar4 = gguf_reader::read<long>
                          ((gguf_reader *)in_stack_fffffffffffffbb0,
                           (long *)in_stack_fffffffffffffba8), !bVar4)) {
      local_31 = false;
    }
    else if (((long)local_78 < 0) || (0xbe82fa0be82fa0 < (long)local_78)) {
      in_RCX = local_78;
      fprintf(_stderr,"%s: number of tensors is %li but must be in [0, %zu]\n",
              "gguf_init_from_file_impl",local_78,0xbe82fa0be82fa0);
      local_31 = false;
    }
    if (((local_31 & 1U) == 0) ||
       (bVar4 = gguf_reader::read<long>
                          ((gguf_reader *)in_stack_fffffffffffffbb0,
                           (long *)in_stack_fffffffffffffba8), !bVar4)) {
      local_31 = false;
    }
    else if (((long)local_70 < 0) || (0x2e8ba2e8ba2e8ba < (long)local_70)) {
      in_RCX = local_70;
      fprintf(_stderr,"%s: number of key value pairs is %li but must be in [0, %zu]\n",
              "gguf_init_from_file_impl",local_70,0x2e8ba2e8ba2e8ba);
      local_31 = false;
    }
    if ((local_31 & 1U) == 0) {
      fprintf(_stderr,"%s: failed to read header\n","gguf_init_from_file_impl");
      gguf_free(in_stack_fffffffffffffbb0);
      local_8 = (gguf_context *)0x0;
    }
    else {
      for (local_80 = 0; (local_31 & 1U) != 0 && local_80 < (long)local_70; local_80 = local_80 + 1)
      {
        std::__cxx11::string::string(local_a0);
        local_a4 = 0xffffffff;
        local_a5 = 0;
        local_b0 = 1;
        local_33a = 0;
        __buf_00 = __buf;
        if ((local_31 & 1U) != 0) {
          sVar18 = gguf_reader::read(&local_28,(int)local_a0,__buf,(size_t)in_RCX);
          local_33a = (byte)sVar18;
          __buf_00 = extraout_RDX;
        }
        local_31 = (bool)(local_33a & 1);
        local_c8 = (uint *)0x0;
        while( true ) {
          puVar9 = local_c8;
          bVar4 = false;
          if ((local_31 & 1U) != 0) {
            in_RCX = (uint *)std::vector<gguf_kv,_std::allocator<gguf_kv>_>::size(&local_30->kv);
            bVar4 = puVar9 < in_RCX;
            __buf_00 = extraout_RDX_00;
          }
          if (!bVar4) break;
          std::vector<gguf_kv,_std::allocator<gguf_kv>_>::operator[]
                    (&local_30->kv,(size_type)local_c8);
          _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffbd0,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
          pFVar21 = _stderr;
          __buf_00 = extraout_RDX_01;
          if (_Var5) {
            in_RCX = (uint *)std::__cxx11::string::c_str();
            fprintf(pFVar21,"%s: duplicate key \'%s\' for tensors %zu and %li \n",
                    "gguf_init_from_file_impl",in_RCX,local_c8,local_80);
            local_31 = false;
            __buf_00 = extraout_RDX_02;
          }
          local_c8 = (uint *)((long)local_c8 + 1);
        }
        if ((local_31 & 1U) == 0) {
          local_60 = 5;
        }
        else {
          local_359 = 0;
          if ((local_31 & 1U) != 0) {
            sVar18 = gguf_reader::read(&local_28,(int)&local_a4,__buf_00,(size_t)in_RCX);
            local_359 = (byte)sVar18;
            __buf_00 = extraout_RDX_03;
          }
          local_31 = (bool)(local_359 & 1);
          if (local_a4 == 9) {
            local_a5 = 1;
            local_35b = 0;
            if (local_31 != false) {
              sVar18 = gguf_reader::read(&local_28,(int)&local_a4,__buf_00,(size_t)in_RCX);
              local_35b = (byte)sVar18;
            }
            local_31 = (bool)(local_35b & 1);
            local_35d = false;
            if (local_31 != false) {
              local_35d = gguf_reader::read<unsigned_long>
                                    ((gguf_reader *)in_stack_fffffffffffffbb0,
                                     in_stack_fffffffffffffba8);
            }
            local_31 = local_35d;
          }
          if (local_31 == false) {
            local_60 = 5;
          }
          else {
            in_RCX = &switchD_0018d44c::switchdataD_001c3790;
            switch(local_a4) {
            case 0:
              local_369 = false;
              if (local_31 != false) {
                in_RCX = (uint *)(ulong)(local_a5 & 1);
                local_369 = gguf_read_emplace_helper<unsigned_char>
                                      ((gguf_reader *)
                                       CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28)
                                       ,(vector<gguf_kv,_std::allocator<gguf_kv>_> *)
                                        CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20
                                                ),in_stack_fffffffffffffc18,
                                       (bool)in_stack_fffffffffffffc17,
                                       CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08)
                                      );
              }
              local_31 = local_369;
              bVar4 = local_31;
              break;
            case 1:
              local_36b = false;
              if (local_31 != false) {
                in_RCX = (uint *)(ulong)(local_a5 & 1);
                local_36b = gguf_read_emplace_helper<signed_char>
                                      ((gguf_reader *)
                                       CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28)
                                       ,(vector<gguf_kv,_std::allocator<gguf_kv>_> *)
                                        CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20
                                                ),in_stack_fffffffffffffc18,
                                       (bool)in_stack_fffffffffffffc17,
                                       CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08)
                                      );
              }
              local_31 = local_36b;
              bVar4 = local_31;
              break;
            case 2:
              local_36d = false;
              if (local_31 != false) {
                in_RCX = (uint *)(ulong)(local_a5 & 1);
                local_36d = gguf_read_emplace_helper<unsigned_short>
                                      ((gguf_reader *)
                                       CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28)
                                       ,(vector<gguf_kv,_std::allocator<gguf_kv>_> *)
                                        CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20
                                                ),in_stack_fffffffffffffc18,
                                       (bool)in_stack_fffffffffffffc17,
                                       CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08)
                                      );
              }
              local_31 = local_36d;
              bVar4 = local_31;
              break;
            case 3:
              local_36f = false;
              if (local_31 != false) {
                in_RCX = (uint *)(ulong)(local_a5 & 1);
                local_36f = gguf_read_emplace_helper<short>
                                      ((gguf_reader *)
                                       CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28)
                                       ,(vector<gguf_kv,_std::allocator<gguf_kv>_> *)
                                        CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20
                                                ),in_stack_fffffffffffffc18,
                                       (bool)in_stack_fffffffffffffc17,
                                       CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08)
                                      );
              }
              local_31 = local_36f;
              bVar4 = local_31;
              break;
            case 4:
              local_371 = false;
              if (local_31 != false) {
                in_RCX = (uint *)(ulong)(local_a5 & 1);
                local_371 = gguf_read_emplace_helper<unsigned_int>
                                      ((gguf_reader *)
                                       CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28)
                                       ,(vector<gguf_kv,_std::allocator<gguf_kv>_> *)
                                        CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20
                                                ),in_stack_fffffffffffffc18,
                                       (bool)in_stack_fffffffffffffc17,
                                       CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08)
                                      );
              }
              local_31 = local_371;
              bVar4 = local_31;
              break;
            case 5:
              local_373 = false;
              if (local_31 != false) {
                in_RCX = (uint *)(ulong)(local_a5 & 1);
                local_373 = gguf_read_emplace_helper<int>
                                      ((gguf_reader *)
                                       CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28)
                                       ,(vector<gguf_kv,_std::allocator<gguf_kv>_> *)
                                        CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20
                                                ),in_stack_fffffffffffffc18,
                                       (bool)in_stack_fffffffffffffc17,
                                       CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08)
                                      );
              }
              local_31 = local_373;
              bVar4 = local_31;
              break;
            case 6:
              local_375 = false;
              if (local_31 != false) {
                in_RCX = (uint *)(ulong)(local_a5 & 1);
                local_375 = gguf_read_emplace_helper<float>
                                      ((gguf_reader *)
                                       CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28)
                                       ,(vector<gguf_kv,_std::allocator<gguf_kv>_> *)
                                        CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20
                                                ),in_stack_fffffffffffffc18,
                                       (bool)in_stack_fffffffffffffc17,
                                       CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08)
                                      );
              }
              local_31 = local_375;
              bVar4 = local_31;
              break;
            case 7:
              local_377 = false;
              if (local_31 != false) {
                in_RCX = (uint *)(ulong)(local_a5 & 1);
                local_377 = gguf_read_emplace_helper<bool>
                                      (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                                       (string *)
                                       CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28)
                                       ,(bool)in_stack_fffffffffffffc27,
                                       (size_t)in_stack_fffffffffffffc18);
              }
              local_31 = local_377;
              bVar4 = local_31;
              break;
            case 8:
              bVar4 = false;
              if (local_31 != false) {
                in_RCX = (uint *)(ulong)(local_a5 & 1);
                bVar4 = gguf_read_emplace_helper<std::__cxx11::string>
                                  (in_stack_fffffffffffffc58,
                                   (vector<gguf_kv,_std::allocator<gguf_kv>_> *)
                                   CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                                   in_stack_fffffffffffffc48,(bool)in_stack_fffffffffffffc47,
                                   (size_t)in_stack_fffffffffffffc38);
              }
              break;
            case 9:
            default:
              pFVar21 = _stderr;
              in_RCX = (uint *)std::__cxx11::string::c_str();
              fprintf(pFVar21,"%s: key \'%s\' has invalid GGUF type %d\n","gguf_init_from_file_impl"
                      ,in_RCX,(ulong)local_a4);
              local_31 = false;
              bVar4 = local_31;
              break;
            case 10:
              bVar4 = false;
              if (local_31 != false) {
                in_RCX = (uint *)(ulong)(local_a5 & 1);
                bVar4 = gguf_read_emplace_helper<unsigned_long>
                                  ((gguf_reader *)
                                   CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                                   (vector<gguf_kv,_std::allocator<gguf_kv>_> *)
                                   CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                                   in_stack_fffffffffffffc18,(bool)in_stack_fffffffffffffc17,
                                   CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
              }
              break;
            case 0xb:
              bVar4 = false;
              if (local_31 != false) {
                in_RCX = (uint *)(ulong)(local_a5 & 1);
                bVar4 = gguf_read_emplace_helper<long>
                                  ((gguf_reader *)
                                   CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                                   (vector<gguf_kv,_std::allocator<gguf_kv>_> *)
                                   CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                                   in_stack_fffffffffffffc18,(bool)in_stack_fffffffffffffc17,
                                   CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
              }
              break;
            case 0xc:
              bVar4 = false;
              if (local_31 != false) {
                in_RCX = (uint *)(ulong)(local_a5 & 1);
                bVar4 = gguf_read_emplace_helper<double>
                                  ((gguf_reader *)
                                   CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                                   (vector<gguf_kv,_std::allocator<gguf_kv>_> *)
                                   CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                                   in_stack_fffffffffffffc18,(bool)in_stack_fffffffffffffc17,
                                   CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
              }
            }
            local_31 = bVar4;
            local_60 = 0;
          }
        }
        std::__cxx11::string::~string(local_a0);
        if (local_60 != 0) break;
      }
      if ((local_31 & 1U) == 0) {
        fprintf(_stderr,"%s: failed to read key-value pairs\n","gguf_init_from_file_impl");
        gguf_free(in_stack_fffffffffffffbb0);
        local_8 = (gguf_context *)0x0;
      }
      else {
        puVar9 = (uint *)std::vector<gguf_kv,_std::allocator<gguf_kv>_>::size(&local_30->kv);
        if (puVar9 != local_70) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/gguf.cpp"
                     ,0x1c7,"GGML_ASSERT(%s) failed","int64_t(ctx->kv.size()) == n_kv");
        }
        iVar10 = gguf_find_key(in_stack_fffffffffffffbd0,
                               (char *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8)
                              );
        local_cc = (int)iVar10;
        if (local_cc == -1) {
          uVar23 = 0x20;
        }
        else {
          uVar23 = gguf_get_val_u32(in_stack_fffffffffffffbb0,(int64_t)in_stack_fffffffffffffba8);
        }
        local_30->alignment = (ulong)uVar23;
        if ((local_30->alignment == 0) ||
           (__nbytes_00 = local_30->alignment - 1, (local_30->alignment & __nbytes_00) != 0)) {
          fprintf(_stderr,"%s: alignment %zu is not a power of 2\n","gguf_init_from_file_impl",
                  local_30->alignment);
          gguf_free(in_stack_fffffffffffffbb0);
          local_8 = (gguf_context *)0x0;
        }
        else {
          local_d8 = 0;
          if ((local_31 & 1U) != 0 && 0 < (long)local_78) {
            std::__cxx11::string::string(local_250);
            bVar22 = 0;
            if ((local_31 & 1U) != 0) {
              sVar18 = gguf_reader::read(&local_28,(int)local_250,__buf_01,__nbytes_00);
              bVar22 = (byte)sVar18;
            }
            local_31 = (bool)(bVar22 & 1);
            uVar11 = std::__cxx11::string::length();
            lVar14 = local_d8;
            if (uVar11 < 0x40) {
              pcVar13 = (char *)std::__cxx11::string::c_str();
              ggml_set_name(&local_230,pcVar13);
              for (local_268 = 0; (local_31 & 1U) != 0 && (long)local_268 < local_d8;
                  local_268 = local_268 + 1) {
                pcVar13 = local_230.name;
                pvVar17 = std::vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>::
                          operator[](&local_30->info,local_268);
                iVar6 = strcmp(pcVar13,(pvVar17->t).name);
                if (iVar6 == 0) {
                  fprintf(_stderr,"%s: duplicate tensor name \'%s\' for tensors %li and %li\n",
                          "gguf_init_from_file_impl",local_230.name,local_268,local_d8);
                  local_31 = false;
                  break;
                }
              }
              local_60 = 0;
            }
            else {
              pFVar21 = _stderr;
              uVar12 = std::__cxx11::string::length();
              fprintf(pFVar21,"%s: tensor name %li is too long: %zu >= %d\n",
                      "gguf_init_from_file_impl",lVar14,uVar12,0x40);
              local_31 = false;
              local_60 = 0xc;
            }
            std::__cxx11::string::~string(local_250);
            if ((local_60 == 0) && ((local_31 & 1U) != 0)) {
              bVar4 = false;
              if ((local_31 & 1U) != 0) {
                bVar4 = gguf_reader::read<unsigned_int>
                                  ((gguf_reader *)in_stack_fffffffffffffbb0,
                                   (uint *)in_stack_fffffffffffffba8);
              }
              local_31 = bVar4;
              fprintf(_stderr,"%s: tensor \'%s\' has invalid number of dimensions: %u > %u\n",
                      "gguf_init_from_file_impl",local_230.name,0xffffffff,4);
              local_31 = false;
            }
          }
          if ((local_31 & 1U) == 0) {
            fprintf(_stderr,"%s: failed to read tensor info\n","gguf_init_from_file_impl");
            gguf_free(in_stack_fffffffffffffbb0);
            local_8 = (gguf_context *)0x0;
          }
          else {
            puVar9 = (uint *)std::vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>::size
                                       (&local_30->info);
            pFVar21 = local_20;
            if (puVar9 != local_78) {
              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/gguf.cpp"
                         ,0x24d,"GGML_ASSERT(%s) failed","int64_t(ctx->info.size()) == n_tensors");
            }
            lVar14 = ftell(local_20);
            iVar6 = fseek(pFVar21,(lVar14 + local_30->alignment) - 1 &
                                  (local_30->alignment - 1 ^ 0xffffffffffffffff),0);
            if (iVar6 == 0) {
              sVar15 = ftell(local_20);
              local_30->offset = sVar15;
              local_30->size = 0;
              for (local_290 = 0;
                  sVar16 = std::vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>::size
                                     (&local_30->info), puVar9 = local_78, local_290 < sVar16;
                  local_290 = local_290 + 1) {
                pvVar17 = std::vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>::
                          operator[](&local_30->info,local_290);
                if (pvVar17->offset != local_30->size) {
                  fprintf(_stderr,"%s: tensor \'%s\' has offset %lu, expected %zu\n",
                          "gguf_init_from_file_impl",(pvVar17->t).name,pvVar17->offset,
                          local_30->size);
                  fprintf(_stderr,"%s: failed to read tensor data\n","gguf_init_from_file_impl");
                  gguf_free(in_stack_fffffffffffffbb0);
                  return (gguf_context *)0x0;
                }
                sVar15 = ggml_nbytes((ggml_tensor *)
                                     CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
                local_30->size =
                     ((sVar15 + local_30->alignment) - 1 &
                     (local_30->alignment - 1 ^ 0xffffffffffffffff)) + local_30->size;
              }
              if (local_10 != (long *)0x0) {
                if ((local_18 & 1) == 0) {
                  lVar14 = (long)local_78 + 1;
                  sVar15 = ggml_tensor_overhead();
                  local_410 = lVar14 * sVar15 + local_30->size;
                }
                else {
                  sVar15 = ggml_tensor_overhead();
                  local_410 = (long)puVar9 * sVar15;
                }
                pgVar7 = (gguf_context *)0x0;
                params_00.mem_size._7_1_ = in_stack_fffffffffffffc17;
                params_00.mem_size._0_7_ = in_stack_fffffffffffffc10;
                params_00.mem_buffer = in_stack_fffffffffffffc18;
                params_00._16_7_ = in_stack_fffffffffffffc20;
                params_00._23_1_ = in_stack_fffffffffffffc27;
                __nbytes = ggml_init(params_00);
                *local_10 = (long)__nbytes;
                if (*local_10 == 0) {
                  fprintf(_stderr,"%s: failed to initialize ggml context for storing tensors\n",
                          "gguf_init_from_file_impl");
                  gguf_free(pgVar7);
                  return (gguf_context *)0x0;
                }
                ctx_00 = (ggml_context *)*local_10;
                local_2e0 = (ggml_tensor *)0x0;
                if ((local_18 & 1) == 0) {
                  local_2e0 = ggml_new_tensor_1d((ggml_context *)pgVar7,
                                                 (ggml_type)((ulong)local_410 >> 0x20),0x18e94a);
                  bVar4 = (local_31 & 1U) != 0;
                  local_421 = bVar4 && local_2e0 != (ggml_tensor *)0x0;
                  local_31 = local_421;
                  if (bVar4 && local_2e0 != (ggml_tensor *)0x0) {
                    ggml_set_name(local_2e0,"GGUF tensor data binary blob");
                  }
                  local_422 = 0;
                  if ((local_31 & 1U) != 0) {
                    sVar18 = gguf_reader::read(&local_28,(int)local_2e0->data,(void *)local_30->size
                                               ,(size_t)__nbytes);
                    local_422 = (byte)sVar18;
                  }
                  local_31 = (bool)(local_422 & 1);
                  if (local_31 == false) {
                    fprintf(_stderr,"%s: failed to read tensor data binary blob\n",
                            "gguf_init_from_file_impl");
                    ggml_free((ggml_context *)0x18ea1c);
                    *local_10 = 0;
                    gguf_free(pgVar7);
                    return (gguf_context *)0x0;
                  }
                  local_30->data = local_2e0->data;
                }
                ggml_set_no_alloc(ctx_00,true);
                local_2e8 = 0;
                while (sVar16 = local_2e8,
                      sVar19 = std::vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>::
                               size(&local_30->info), sVar16 < sVar19) {
                  pvVar17 = std::vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>::
                            operator[](&local_30->info,local_2e8);
                  tensor = ggml_new_tensor((ggml_context *)pgVar7,
                                           (ggml_type)((ulong)local_410 >> 0x20),(int)local_410,
                                           (int64_t *)0x18eafa);
                  bVar4 = (local_31 & 1U) != 0;
                  local_31 = bVar4 && tensor != (ggml_tensor *)0x0;
                  if (!bVar4 || tensor == (ggml_tensor *)0x0) break;
                  ggml_set_name(tensor,(pvVar17->t).name);
                  if ((local_18 & 1) == 0) {
                    tensor->data = (void *)((long)local_2e0->data + pvVar17->offset);
                  }
                  local_2e8 = local_2e8 + 1;
                }
                if ((local_31 & 1U) == 0) {
                  fprintf(_stderr,"%s: failed to create tensors\n","gguf_init_from_file_impl");
                  ggml_free((ggml_context *)0x18ebdf);
                  *local_10 = 0;
                  gguf_free(pgVar7);
                  return (gguf_context *)0x0;
                }
                ggml_set_no_alloc(ctx_00,(_Bool)(local_18 & 1));
              }
              local_8 = local_30;
            }
            else {
              fprintf(_stderr,"%s: failed to seek to beginning of data section\n",
                      "gguf_init_from_file_impl");
              gguf_free(in_stack_fffffffffffffbb0);
              local_8 = (gguf_context *)0x0;
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

struct gguf_context * gguf_init_from_file_impl(FILE * file, struct gguf_init_params params) {
    const struct gguf_reader gr(file);
    struct gguf_context * ctx = new gguf_context;

    bool ok = true;

    // file magic
    {
        std::vector<char> magic;
        ok = ok && gr.read(magic, 4);

        if (!ok) {
            fprintf(stderr, "%s: failed to read magic\n", __func__);
            gguf_free(ctx);
            return nullptr;
        }

        for (uint32_t i = 0; i < magic.size(); i++) {
            if (magic[i] != GGUF_MAGIC[i]) {
                fprintf(stderr, "%s: invalid magic characters: '%c%c%c%c', expected 'GGUF'\n", __func__, magic[0], magic[1], magic[2], magic[3]);
                gguf_free(ctx);
                return nullptr;
            }
        }
    }

    // header
    int64_t n_kv      = 0;
    int64_t n_tensors = 0;

    if (ok && gr.read(ctx->version)) {
        if (ctx->version == 1) {
            fprintf(stderr, "%s: GGUFv1 is no longer supported, please use a more up-to-date version\n", __func__);
            ok = false;
        }
        if (ctx->version > GGUF_VERSION) {
            fprintf(stderr, "%s: this GGUF file is version %" PRIu32 " but this software only supports up to version %d\n",
                __func__, ctx->version, GGUF_VERSION);
            ok = false;
        }
    } else {
        ok = false;
    }

    if (ok && gr.read(n_tensors)) {
        static_assert(sizeof(size_t) <= 8 && sizeof(gguf_tensor_info) >= 2, "int64_t insufficient for indexing");
        if (n_tensors < 0 || n_tensors > int64_t(SIZE_MAX/sizeof(gguf_tensor_info))) {
            fprintf(stderr, "%s: number of tensors is %" PRIi64 " but must be in [0, %zu]\n",
                __func__, n_tensors, SIZE_MAX/sizeof(gguf_tensor_info));
            ok = false;
        }
    } else {
        ok = false;
    }

    if (ok && gr.read(n_kv)) {
        static_assert(sizeof(size_t) <= 8 && sizeof(gguf_tensor_info) >= 2, "int64_t insufficient for indexing");
        if (n_kv < 0 || n_kv > int64_t(SIZE_MAX/sizeof(gguf_kv))) {
            fprintf(stderr, "%s: number of key value pairs is %" PRIi64 " but must be in [0, %zu]\n",
                    __func__, n_kv, SIZE_MAX/sizeof(gguf_kv));
            ok = false;
        }
    } else {
        ok = false;
    }

    if (!ok) {
        fprintf(stderr, "%s: failed to read header\n", __func__);
        gguf_free(ctx);
        return nullptr;
    }

    // KV pairs
    {
        for (int64_t i = 0; ok && i < n_kv; ++i) {
            std::string key;
            gguf_type   type     = gguf_type(-1);
            bool        is_array = false;
            uint64_t    n        = 1;

            try {
                ok = ok && gr.read(key);
            } catch (std::length_error &) {
                fprintf(stderr, "%s: encountered length_error while reading key %" PRIi64 "\n", __func__, i);
                ok = false;
            } catch (std::bad_alloc &) {
                fprintf(stderr, "%s: encountered bad_alloc error while reading key %" PRIi64 "\n", __func__, i);
                ok = false;
            }
            for (size_t j = 0; ok && j < ctx->kv.size(); ++j) {
                if (key == ctx->kv[j].key) {
                    fprintf(stderr, "%s: duplicate key '%s' for tensors %zu and %" PRIi64 " \n", __func__, key.c_str(), j, i);
                    ok = false;
                }
            }
            if (!ok) {
                break;
            }

            ok = ok && gr.read(type);
            if (type == GGUF_TYPE_ARRAY) {
                is_array = true;
                ok = ok && gr.read(type);
                ok = ok && gr.read(n);
            }
            if (!ok) {
                break;
            }

            switch (type) {
                case GGUF_TYPE_UINT8:   ok = ok && gguf_read_emplace_helper<uint8_t>    (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_INT8:    ok = ok && gguf_read_emplace_helper<int8_t>     (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_UINT16:  ok = ok && gguf_read_emplace_helper<uint16_t>   (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_INT16:   ok = ok && gguf_read_emplace_helper<int16_t>    (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_UINT32:  ok = ok && gguf_read_emplace_helper<uint32_t>   (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_INT32:   ok = ok && gguf_read_emplace_helper<int32_t>    (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_FLOAT32: ok = ok && gguf_read_emplace_helper<float>      (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_BOOL:    ok = ok && gguf_read_emplace_helper<bool>       (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_STRING:  ok = ok && gguf_read_emplace_helper<std::string>(gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_UINT64:  ok = ok && gguf_read_emplace_helper<uint64_t>   (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_INT64:   ok = ok && gguf_read_emplace_helper<int64_t>    (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_FLOAT64: ok = ok && gguf_read_emplace_helper<double>     (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_ARRAY:
                default:
                    {
                        fprintf(stderr, "%s: key '%s' has invalid GGUF type %d\n", __func__, key.c_str(), type);
                        ok = false;
                    } break;
            }
        }

        if (!ok) {
            fprintf(stderr, "%s: failed to read key-value pairs\n", __func__);
            gguf_free(ctx);
            return nullptr;
        }
        GGML_ASSERT(int64_t(ctx->kv.size()) == n_kv);

        const int alignment_idx = gguf_find_key(ctx, GGUF_KEY_GENERAL_ALIGNMENT);
        ctx->alignment = alignment_idx == -1 ? GGUF_DEFAULT_ALIGNMENT : gguf_get_val_u32(ctx, alignment_idx);

        if (ctx->alignment == 0 || (ctx->alignment & (ctx->alignment - 1)) != 0) {
            fprintf(stderr, "%s: alignment %zu is not a power of 2\n", __func__, ctx->alignment);
            gguf_free(ctx);
            return nullptr;
        }
    }

    // read the tensor info
    for (int64_t i = 0; ok && i < n_tensors; ++i) {
        struct gguf_tensor_info info;

        // tensor name
        {
            std::string name;
            try {
                ok = ok && gr.read(name);
            } catch (std::length_error &) {
                fprintf(stderr, "%s: encountered length_error while reading tensor name %" PRIi64 "\n", __func__, i);
                ok = false;
            } catch (std::bad_alloc &) {
                fprintf(stderr, "%s: encountered bad_alloc error while reading tensor name %" PRIi64 "\n", __func__, i);
                ok = false;
            }
            if (name.length() >= GGML_MAX_NAME) {
                fprintf(stderr, "%s: tensor name %" PRIi64 " is too long: %zu >= %d\n", __func__, i, name.length(), GGML_MAX_NAME);
                ok = false;
                break;
            }
            ggml_set_name(&info.t, name.c_str());

            // make sure there are no duplicate tensor names
            for (int64_t j = 0; ok && j < i; ++j) {
                if (strcmp(info.t.name, ctx->info[j].t.name) == 0) {
                    fprintf(stderr, "%s: duplicate tensor name '%s' for tensors %" PRIi64 " and %" PRIi64 "\n", __func__, info.t.name, j, i);
                    ok = false;
                    break;
                }
            }
        }
        if (!ok) {
            break;
        }

        // tensor shape
        {
            uint32_t n_dims = -1;
            ok = ok && gr.read(n_dims);
            if (n_dims > GGML_MAX_DIMS) {
                fprintf(stderr, "%s: tensor '%s' has invalid number of dimensions: %" PRIu32 " > %" PRIu32 "\n",
                    __func__, info.t.name, n_dims, GGML_MAX_DIMS);
                ok = false;
                break;
            }
            for (uint32_t j = 0; ok && j < GGML_MAX_DIMS; ++j) {
                info.t.ne[j] = 1;
                if (j < n_dims) {
                    ok = ok && gr.read(info.t.ne[j]);
                }

                // check that all ne are non-negative
                if (info.t.ne[j] < 0) {
                    fprintf(stderr, "%s: tensor '%s' dimension %" PRIu32 " has invalid number of elements: %" PRIi64 " < 0\n",
                        __func__, info.t.name, j, info.t.ne[j]);
                    ok = false;
                    break;
                }
            }

            // check that the total number of elements is representable
            if (ok && ((INT64_MAX/info.t.ne[1] <= info.t.ne[0]) ||
                       (INT64_MAX/info.t.ne[2] <= info.t.ne[0]*info.t.ne[1]) ||
                       (INT64_MAX/info.t.ne[3] <= info.t.ne[0]*info.t.ne[1]*info.t.ne[2]))) {

                fprintf(stderr, "%s: total number of elements in tensor '%s' with shape "
                    "(%" PRIi64 ", %" PRIi64 ", %" PRIi64 ", %" PRIi64 ") is >= %" PRIi64 "\n",
                    __func__, info.t.name, info.t.ne[0], info.t.ne[1], info.t.ne[2], info.t.ne[3], INT64_MAX);
                ok = false;
                break;
            }
        }
        if (!ok) {
            break;
        }

        // tensor type
        {
            ok = ok && gr.read(info.t.type);

            // check that tensor type is within defined range
            if (info.t.type < 0 || info.t.type >= GGML_TYPE_COUNT) {
                fprintf(stderr, "%s: tensor '%s' has invalid ggml type %d (%s)\n",
                    __func__, info.t.name, info.t.type, ggml_type_name(info.t.type));
                ok = false;
                break;
            }
            const size_t  type_size = ggml_type_size(info.t.type);
            const int64_t blck_size = ggml_blck_size(info.t.type);

            // check that row size is divisible by block size
            if (blck_size == 0 || info.t.ne[0] % blck_size != 0) {
                fprintf(stderr, "%s: tensor '%s' of type %d (%s) has %" PRId64 " elements per row, "
                    "not a multiple of block size (%" PRId64 ")\n",
                    __func__, info.t.name, (int) info.t.type, ggml_type_name(info.t.type), info.t.ne[0], blck_size);
                ok = false;
                break;
            }

            // calculate byte offsets given the tensor shape and type
            info.t.nb[0] = type_size;
            info.t.nb[1] = info.t.nb[0]*(info.t.ne[0]/blck_size);
            for (int j = 2; j < GGML_MAX_DIMS; ++j) {
                info.t.nb[j] = info.t.nb[j - 1]*info.t.ne[j - 1];
            }
        }
        if (!ok) {
            break;
        }

        // tensor data offset within buffer
        ok = ok && gr.read(info.offset);

        ctx->info.push_back(info);
    }

    if (!ok) {
        fprintf(stderr, "%s: failed to read tensor info\n", __func__);
        gguf_free(ctx);
        return nullptr;
    }
    GGML_ASSERT(int64_t(ctx->info.size()) == n_tensors);

    // we require the data section to be aligned, so take into account any padding
    if (fseek(file, GGML_PAD(ftell(file), ctx->alignment), SEEK_SET) != 0) {
        fprintf(stderr, "%s: failed to seek to beginning of data section\n", __func__);
        gguf_free(ctx);
        return nullptr;
    }

    // store the current file offset - this is where the data section starts
    ctx->offset = ftell(file);

    // compute the total size of the data section, taking into account the alignment
    {
        ctx->size = 0;
        for (size_t i = 0; i < ctx->info.size(); ++i) {
            const gguf_tensor_info & ti = ctx->info[i];
            if (ti.offset != ctx->size) {
                fprintf(stderr, "%s: tensor '%s' has offset %" PRIu64 ", expected %zu\n",
                    __func__, ti.t.name, ti.offset, ctx->size);
                fprintf(stderr, "%s: failed to read tensor data\n", __func__);
                gguf_free(ctx);
                return nullptr;
            }
            ctx->size += GGML_PAD(ggml_nbytes(&ti.t), ctx->alignment);
        }
    }

    // load the tensor data only if requested
    if (params.ctx != nullptr) {
        // if the provided gguf_context is no_alloc, then we create "empty" tensors and do not read the binary blob
        // otherwise, we load the binary blob into the created ggml_context as well, and point the "data" members of
        //   the ggml_tensor structs to the appropriate locations in the binary blob

        // compute the exact size needed for the new ggml_context
        const size_t mem_size =
            params.no_alloc ?
            (n_tensors    )*ggml_tensor_overhead() :
            (n_tensors + 1)*ggml_tensor_overhead() + ctx->size;

        struct ggml_init_params pdata = {
            /*mem_size   =*/ mem_size,
            /*mem_buffer =*/ nullptr,
            /*no_alloc   =*/ params.no_alloc,
        };

        *params.ctx = ggml_init(pdata);
        if (*params.ctx == nullptr) {
            fprintf(stderr, "%s: failed to initialize ggml context for storing tensors\n", __func__);
            gguf_free(ctx);
            return nullptr;
        }

        struct ggml_context * ctx_data = *params.ctx;

        struct ggml_tensor * data = nullptr;

        if (!params.no_alloc) {
            data = ggml_new_tensor_1d(ctx_data, GGML_TYPE_I8, ctx->size);

            ok = ok && data != nullptr;

            if (ok) {
                ggml_set_name(data, "GGUF tensor data binary blob");
            }

            // read the binary blob with the tensor data
            ok = ok && gr.read(data->data, ctx->size);

            if (!ok) {
                fprintf(stderr, "%s: failed to read tensor data binary blob\n", __func__);
                ggml_free(ctx_data);
                *params.ctx = nullptr;
                gguf_free(ctx);
                return nullptr;
            }

            ctx->data = data->data;
        }

        ggml_set_no_alloc(ctx_data, true);

        // create the tensors
        for (size_t i = 0; i < ctx->info.size(); ++i) {
            const struct gguf_tensor_info & info = ctx->info[i];

            struct ggml_tensor * cur = ggml_new_tensor(ctx_data, info.t.type, GGML_MAX_DIMS, info.t.ne);

            ok = ok && cur != nullptr;

            if (!ok) {
                break;
            }

            ggml_set_name(cur, info.t.name);

            // point the data member to the appropriate location in the binary blob using the tensor info
            if (!params.no_alloc) {
                cur->data = (char *) data->data + info.offset;
            }
        }

        if (!ok) {
            fprintf(stderr, "%s: failed to create tensors\n", __func__);
            ggml_free(ctx_data);
            *params.ctx = nullptr;
            gguf_free(ctx);
            return nullptr;
        }

        ggml_set_no_alloc(ctx_data, params.no_alloc);
    }

    return ctx;
}